

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O3

Gia_Man_t * Gia_ManFront(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  char *pcVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  undefined1 *__ptr;
  Gia_Obj_t *pGVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  uint local_4c;
  
  uVar7 = Gia_ManCrossCutSimple(p);
  Gia_ManCreateValueRefs(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  iVar17 = (int)((float)(int)uVar7 * 1.1) + 1;
  p_00->nFront = iVar17;
  __ptr = (undefined1 *)calloc((long)iVar17,1);
  if ((int)((float)(int)uVar7 * 1.1) < 0) {
LAB_007463e4:
    __assert_fail("iFront < nFront",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                  ,0x2f,"int Gia_ManFrontFindNext(char *, int, int)");
  }
  *__ptr = 1;
  p_00->pObjs->Value = 0;
  bVar21 = p->pObjs->Value != 0;
  if (!bVar21) {
    *__ptr = 0;
  }
  uVar20 = (uint)bVar21;
  iVar17 = p->nObjs;
  local_4c = 0;
  if (1 < iVar17) {
    uVar12 = 0;
    lVar18 = 1;
    local_4c = 0;
    do {
      pGVar1 = p->pObjs + lVar18;
      uVar19 = (uint)*(ulong *)pGVar1;
      if ((uVar19 & 0x9fffffff) == 0x9fffffff) {
        uVar19 = uVar20 + 1;
        if ((int)uVar20 < (int)local_4c) {
          uVar19 = local_4c;
        }
        if (pGVar1->Value != 0) {
          local_4c = uVar19;
          uVar20 = uVar20 + 1;
        }
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar4 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_00746387:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p_00->pObjs;
        if (pGVar10 < pGVar5) goto LAB_00746387;
        iVar17 = p_00->nObjs;
        if (pGVar5 + iVar17 <= pGVar10) goto LAB_00746387;
        uVar19 = (int)((long)pGVar10 - (long)pGVar5 >> 2) * -0x55555555;
        if ((uVar19 >> 0x1e & 1) != 0) {
LAB_00746403:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (iVar17 <= (int)(uVar19 & 0x3fffffff)) goto LAB_007463a6;
        uVar19 = uVar19 & 0x3fffffff;
        if ((((long)iVar17 <= (long)(ulong)uVar19) || (pGVar10 = p->pObjs, pGVar1 < pGVar10)) ||
           (pGVar10 + p->nObjs <= pGVar1)) goto LAB_00746387;
        if (uVar19 != (int)((ulong)((long)pGVar1 - (long)pGVar10) >> 2) * -0x55555555) {
          __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                        ,0xb4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        if (p_00->nFront <= (int)uVar12) goto LAB_007463e4;
        for (; __ptr[(int)uVar12] != '\0'; uVar12 = (int)(uVar12 + 1) % p_00->nFront) {
        }
        __ptr[(int)uVar12] = 1;
        pGVar5[uVar19].Value = uVar12;
        if (pGVar1->Value == 0) {
          __ptr[(int)uVar12] = 0;
        }
      }
      else {
        iVar17 = (int)lVar18;
        if ((~uVar19 & 0x1fffffff) == 0 || -1 < (int)uVar19) {
          uVar19 = uVar20 + 1;
          if ((int)uVar20 < (int)local_4c) {
            uVar19 = local_4c;
          }
          if (pGVar1->Value != 0) {
            local_4c = uVar19;
            uVar20 = uVar20 + 1;
          }
          pGVar10 = Gia_ManAppendObj(p_00);
          pGVar5 = p_00->pObjs;
          if (((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) ||
             ((pGVar6 = p->pObjs, pGVar1 < pGVar6 || (pGVar6 + p->nObjs <= pGVar1))))
          goto LAB_00746387;
          if ((int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555 !=
              (int)((ulong)((long)pGVar1 - (long)pGVar6) >> 2) * -0x55555555) {
            __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                          ,0xd4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar19 = iVar17 - (*(uint *)pGVar1 & 0x1fffffff);
          if (((int)uVar19 < 0) || (p_00->nObjs <= (int)uVar19)) {
LAB_007463a6:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar5[uVar19].Value == 0x1fffffff) {
            __assert_fail("pFanin0New->Value != GIA_NONE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                          ,0xd7,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar11 = (ulong)(pGVar5[uVar19].Value & 0x1fffffff);
          uVar4 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar4 & 0xffffffffe0000000 | uVar11;
          uVar15 = (ulong)((uint)*(ulong *)pGVar1 & 0x20000000);
          *(ulong *)pGVar10 = uVar4 & 0xffffffffc0000000 | uVar11 | uVar15;
          uVar13 = iVar17 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
          if (((int)uVar13 < 0) || (p_00->nObjs <= (int)uVar13)) goto LAB_007463a6;
          pGVar6 = p_00->pObjs;
          uVar14 = pGVar6[uVar13].Value;
          if (uVar14 == 0x1fffffff) {
            __assert_fail("pFanin1New->Value != GIA_NONE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                          ,0xdc,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar16 = (ulong)(uVar14 & 0x1fffffff) << 0x20;
          *(ulong *)pGVar10 = uVar4 & 0xe0000000c0000000 | uVar11 | uVar15 | uVar16;
          *(ulong *)pGVar10 =
               uVar4 & 0xc0000000c0000000 | uVar11 | uVar15 | uVar16 |
               *(ulong *)pGVar1 & 0x2000000000000000;
          if (p_00->nFront <= (int)uVar12) goto LAB_007463e4;
          for (; __ptr[(int)uVar12] != '\0'; uVar12 = (int)(uVar12 + 1) % p_00->nFront) {
          }
          __ptr[(int)uVar12] = 1;
          pGVar10->Value = uVar12;
          uVar4 = *(ulong *)pGVar1;
          puVar2 = &pGVar1[-(ulong)((uint)uVar4 & 0x1fffffff)].Value;
          *puVar2 = *puVar2 - 1;
          if (*puVar2 == 0) {
            __ptr[pGVar5[uVar19].Value] = 0;
            uVar20 = uVar20 - 1;
          }
          puVar2 = &pGVar1[-(ulong)((uint)(uVar4 >> 0x20) & 0x1fffffff)].Value;
          *puVar2 = *puVar2 - 1;
          if (*puVar2 == 0) {
            __ptr[pGVar6[uVar13].Value] = 0;
            uVar20 = uVar20 - 1;
          }
          if (pGVar1->Value == 0) {
            __ptr[(int)uVar12] = 0;
          }
        }
        else {
          if (pGVar1->Value != 0) {
            __assert_fail("Gia_ObjValue(pObj) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                          ,0xbd,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          if (p_00->nObjs < 1) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          if ((~*(uint *)p_00->pObjs & 0x1fffffff) != 0 && (int)*(uint *)p_00->pObjs < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar4 | 0x80000000;
          pGVar5 = p_00->pObjs;
          if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00746387;
          uVar11 = (ulong)(((uint)((int)pGVar10 - (int)pGVar5) >> 2) * -0x55555555 & 0x1fffffff);
          *(ulong *)pGVar10 = uVar4 & 0xffffffffc0000000 | 0x80000000 | uVar11;
          *(ulong *)pGVar10 =
               uVar4 & 0xe0000000c0000000 | 0x80000000 | uVar11 |
               (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00746387;
          Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
          if (p_00->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p_00,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),
                             pGVar10);
          }
          pGVar5 = p_00->pObjs;
          if (pGVar10 < pGVar5) goto LAB_00746387;
          uVar19 = p_00->nObjs;
          if (pGVar5 + (int)uVar19 <= pGVar10) goto LAB_00746387;
          uVar13 = (int)((long)pGVar10 - (long)pGVar5 >> 2) * -0x55555555;
          if ((uVar13 >> 0x1e & 1) != 0) goto LAB_00746403;
          if ((int)uVar19 <= (int)(uVar13 & 0x3fffffff)) goto LAB_007463a6;
          uVar13 = uVar13 & 0x3fffffff;
          if ((((long)(int)uVar19 <= (long)(ulong)uVar13) || (pGVar10 = p->pObjs, pGVar1 < pGVar10))
             || (pGVar10 + p->nObjs <= pGVar1)) goto LAB_00746387;
          if (uVar13 != (int)((ulong)((long)pGVar1 - (long)pGVar10) >> 2) * -0x55555555) {
            __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                          ,0xc1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar14 = iVar17 - (*(uint *)pGVar1 & 0x1fffffff);
          if (((int)uVar14 < 0) || (uVar19 <= uVar14)) goto LAB_007463a6;
          if (pGVar5[uVar14].Value == 0x1fffffff) {
            __assert_fail("pFanin0New->Value != GIA_NONE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                          ,0xc4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          pGVar10 = pGVar5 + uVar13;
          pGVar10->Value = 0x1fffffff;
          uVar11 = (ulong)pGVar5[uVar14].Value & 0x1fffffff;
          uVar4 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar4 & 0xffffffffe0000000 | uVar11;
          *(ulong *)pGVar10 =
               uVar4 & 0xffffffffc0000000 | uVar11 | (ulong)((uint)*(ulong *)pGVar1 & 0x20000000);
          puVar2 = &pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value;
          *puVar2 = *puVar2 - 1;
          if (*puVar2 == 0) {
            __ptr[pGVar5[uVar14].Value] = 0;
            uVar20 = uVar20 - 1;
          }
        }
      }
      lVar18 = lVar18 + 1;
      iVar17 = p->nObjs;
    } while (lVar18 < iVar17);
  }
  if (p_00->nObjs != iVar17) {
    __assert_fail("pNew->nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                  ,0xf0,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
  }
  if ((uVar20 != 0) && (local_4c != uVar7)) {
    __assert_fail("nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                  ,0xf1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
  }
  if (0 < (long)p_00->nFront) {
    lVar18 = 0;
    do {
      if (__ptr[lVar18] != '\0') {
        __assert_fail("pFront[i] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                      ,0xf3,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      lVar18 = lVar18 + 1;
    } while (p_00->nFront != lVar18);
  }
  free(__ptr);
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFront( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFanin0New, * pFanin1New, * pObjNew;
    char * pFront;    // places used for the frontier
    int i, iLit, nCrossCut = 0, nCrossCutMax = 0;
    int nCrossCutMaxInit = Gia_ManCrossCutSimple( p );
    int iFront = 0;//, clk = Abc_Clock(); 
    // set references for all objects
    Gia_ManCreateValueRefs( p );
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nFront = 1 + (int)((float)1.1 * nCrossCutMaxInit); 
    // start the frontier
    pFront = ABC_CALLOC( char, pNew->nFront );
    // add constant node
    Gia_ManConst0(pNew)->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
    if ( Gia_ObjValue(Gia_ManConst0(p)) == 0 )
        pFront[iFront] = 0;
    else
        nCrossCut = 1;
    // iterate through the objects
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
                nCrossCutMax = nCrossCut;
            // create new node
            iLit = Gia_ManAppendCi( pNew );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
            // handle CIs without fanout
            if ( Gia_ObjValue(pObj) == 0 )
                pFront[iFront] = 0;
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == 0 );
            // create new node
            iLit = Gia_ManAppendCo( pNew, 0 );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            // get the fanin
            pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
            assert( pFanin0New->Value != GIA_NONE );
            pObjNew->Value = GIA_NONE;
            pObjNew->iDiff0 = pFanin0New->Value;
            pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
            // deref the fanin
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
            {
                pFront[pFanin0New->Value] = 0;
                nCrossCut--;
            }
            continue;
        }
        if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
            nCrossCutMax = nCrossCut;
        // create new node
        pObjNew = Gia_ManAppendObj( pNew );
        assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
        // assign the first fanin
        pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
        assert( pFanin0New->Value != GIA_NONE );
        pObjNew->iDiff0 = pFanin0New->Value;
        pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
        // assign the second fanin
        pFanin1New = Gia_ManObj( pNew, Gia_ObjFaninId1(pObj, i) );
        assert( pFanin1New->Value != GIA_NONE );
        pObjNew->iDiff1 = pFanin1New->Value;
        pObjNew->fCompl1 = Gia_ObjFaninC1(pObj);
        // assign the frontier number
        pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
        // deref the fanins
        if ( --Gia_ObjFanin0(pObj)->Value == 0 )
        {
            pFront[pFanin0New->Value] = 0;
            nCrossCut--;
        }
        if ( --Gia_ObjFanin1(pObj)->Value == 0 )
        {
            pFront[pFanin1New->Value] = 0;
            nCrossCut--;
        }
        // handle nodes without fanout (choice nodes)
        if ( Gia_ObjValue(pObj) == 0 )
            pFront[iFront] = 0;
    }
    assert( pNew->nObjs == p->nObjs );
    assert( nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit );
    for ( i = 0; i < pNew->nFront; i++ )
        assert( pFront[i] == 0 );
    ABC_FREE( pFront );
//printf( "Crosscut = %6d. Frontier = %6d. ", nCrossCutMaxInit, pNew->nFront );
//ABC_PRT( "Time", Abc_Clock() - clk );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}